

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::INC_ZP(CPU *this)

{
  byte bVar1;
  uint8_t uVar2;
  byte data;
  uint8_t result;
  uint8_t addr;
  CPU *this_local;
  
  this->cycles = 5;
  bVar1 = GetByte(this);
  uVar2 = ReadByte(this,(ushort)bVar1);
  data = uVar2 + 1;
  this->cycles = this->cycles - 1;
  WriteByte(this,(ushort)bVar1,data);
  (this->field_6).ps = (this->field_6).ps & 0xfd | (data == 0) << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((data & 0x80) != 0 && -1 < (int)(data & 0x80)) << 7;
  return;
}

Assistant:

void CPU::INC_ZP()
{
    cycles = 5;
    uint8_t addr = GetByte(), result = ReadByte(addr) + 1;
    cycles--;
    WriteByte(addr, result);
    Z = (result == 0);
    N = (result & 0b10000000) > 0;
}